

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeWriter.h
# Opt level: O0

void __thiscall Js::ByteCodeWriter::Data::Encode(Data *this,OpCodeAsmJs op,ByteCodeWriter *writer)

{
  ByteCodeWriter *writer_local;
  OpCodeAsmJs op_local;
  Data *this_local;
  
  EncodeT<(Js::LayoutSize)0>(this,op,writer,false);
  return;
}

Assistant:

void Encode(OpCodeAsmJs op, ByteCodeWriter* writer){ EncodeT<Js::SmallLayout>(op, writer, /*isPatching*/false); }